

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

map_index_t __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::BucketNumber
          (KeyMapBase<unsigned_int> *this,ViewType k)

{
  ulong key;
  undefined1 auVar1 [16];
  map_index_t mVar2;
  string *psVar3;
  map_index_t local_2c;
  map_index_t local_28 [4];
  
  key = CONCAT44(0,k);
  local_28[0] = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,key);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = key;
  local_2c = UntypedMapBase::VariantBucketNumber
                       (&this->super_UntypedMapBase,(VariantKey)(auVar1 << 0x40));
  psVar3 = absl::lts_20240722::log_internal::Check_EQImpl<unsigned_int,unsigned_int>
                     (local_28,&local_2c,
                      "VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)) == VariantBucketNumber(RealKeyToVariantKey<Key>{}(k))"
                     );
  if (psVar3 == (string *)0x0) {
    mVar2 = UntypedMapBase::VariantBucketNumber(&this->super_UntypedMapBase,key);
    return mVar2;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map.h"
             ,0x467,psVar3->_M_string_length,(psVar3->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

map_index_t BucketNumber(typename TS::ViewType k) const {
    ABSL_DCHECK_EQ(
        VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k)),
        VariantBucketNumber(RealKeyToVariantKey<Key>{}(k)));
    return VariantBucketNumber(RealKeyToVariantKeyAlternative<Key>{}(k));
  }